

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<long_long>::relocate
          (QArrayDataPointer<long_long> *this,qsizetype offset,longlong **data)

{
  longlong *d_first;
  longlong *plVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<long_long,long_long>(this->ptr,this->size,d_first);
  if (data != (longlong **)0x0) {
    plVar1 = *data;
    if ((this->ptr <= plVar1) && (plVar1 < this->ptr + this->size)) {
      *data = plVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }